

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSocketCommon.cpp
# Opt level: O1

ssize_t PosixSocketCommon::read(int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  sockaddr *in_RCX;
  double in_XMM0_Qa;
  socklen_t local_34;
  double local_30;
  pollfd local_28;
  
  local_30 = in_XMM0_Qa;
  uVar1 = fcntl(__fd,3);
  if ((0.0 < local_30) && ((uVar1 & 0x800) == 0)) {
    local_28.events = 1;
    local_28.fd = __fd;
    iVar2 = poll(&local_28,1,(int)(local_30 * 1000.0));
    if (iVar2 == 0) {
      return 0;
    }
  }
  sVar3 = recvfrom(__fd,__buf,__nbytes & 0xffffffff,0,in_RCX,&local_34);
  return sVar3;
}

Assistant:

int PosixSocketCommon::read(int          socket_fd,
                            char*        buffer,
                            unsigned int size,
                            double       class_ts_bt,
                            sockaddr*    class_rfa,
                            socklen_t    class_rfa_size)
{
    // Is a valid timeout set?
    if (isBlockingEnabled(socket_fd) && class_ts_bt > 0.0)
    {
        // Perform the blocking timeout and check if the POLLIN event occurred
        if (doBlockingTimeout(socket_fd, POLLIN, class_ts_bt) == 0)
        {
            // No data is ready to read, just return
            return 0;
        }
    }

    // Read data
    int ret = recvfrom(socket_fd, buffer, size, 0, class_rfa, &class_rfa_size);

#if defined DEBUG
    if (ret == -1)
    {
        perror("PosixSocketCommon::read");
    }
#endif

    return ret;
}